

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hash.h
# Opt level: O0

robin_hash<std::pair<unsigned_long,_ImputedData<long,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
* __thiscall
tsl::detail_robin_hash::
robin_hash<std::pair<unsigned_long,_ImputedData<long,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
::operator=(robin_hash<std::pair<unsigned_long,_ImputedData<long,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
            *this,robin_hash<std::pair<unsigned_long,_ImputedData<long,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                  *other)

{
  robin_hash<std::pair<unsigned_long,_ImputedData<long,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  *in_RSI;
  robin_hash<std::pair<unsigned_long,_ImputedData<long,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  *in_RDI;
  
  swap(in_RSI,in_RDI);
  clear_and_shrink(in_RSI);
  return in_RDI;
}

Assistant:

robin_hash& operator=(robin_hash&& other) {
    other.swap(*this);
    other.clear_and_shrink();

    return *this;
  }